

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall
ConnmanTestMsg::ReceiveMsgFrom(ConnmanTestMsg *this,CNode *node,CSerializedNetMsg *ser_msg)

{
  _Head_base<0UL,_Transport_*,_false> _Var1;
  int iVar2;
  ConnmanTestMsg *this_00;
  long in_FS_OFFSET;
  Span<const_unsigned_char> msg_bytes;
  undefined1 auStack_48 [39];
  bool complete;
  atomic<unsigned_long> local_20;
  
  local_20.super___atomic_base<unsigned_long>._M_i =
       *(__atomic_base<unsigned_long> *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
       _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
       super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
  iVar2 = (*(_Var1._M_head_impl)->_vptr_Transport[6])(_Var1._M_head_impl,ser_msg);
  if ((char)iVar2 == '\0') {
    __assert_fail("queued",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                  ,0x5e,"bool ConnmanTestMsg::ReceiveMsgFrom(CNode &, CSerializedNetMsg &&) const");
  }
  complete = false;
  while( true ) {
    _Var1._M_head_impl =
         (node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
         _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
         super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
    this_00 = (ConnmanTestMsg *)auStack_48;
    (*(_Var1._M_head_impl)->_vptr_Transport[7])(auStack_48,_Var1._M_head_impl,0);
    if ((__pthread_internal_list *)auStack_48._24_8_ == (__pthread_internal_list *)0x0) break;
    msg_bytes.m_size = auStack_48._24_8_;
    msg_bytes.m_data = (uchar *)auStack_48._16_8_;
    NodeReceiveMsgBytes(this_00,node,msg_bytes,&complete);
    _Var1._M_head_impl =
         (node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
         _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
         super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
    (*(_Var1._M_head_impl)->_vptr_Transport[8])(_Var1._M_head_impl,auStack_48._24_8_);
  }
  if ((__atomic_base<unsigned_long>)*(__int_type_conflict *)(in_FS_OFFSET + 0x28) ==
      local_20.super___atomic_base<unsigned_long>._M_i) {
    return complete;
  }
  __stack_chk_fail();
}

Assistant:

bool ConnmanTestMsg::ReceiveMsgFrom(CNode& node, CSerializedNetMsg&& ser_msg) const
{
    bool queued = node.m_transport->SetMessageToSend(ser_msg);
    assert(queued);
    bool complete{false};
    while (true) {
        const auto& [to_send, _more, _msg_type] = node.m_transport->GetBytesToSend(false);
        if (to_send.empty()) break;
        NodeReceiveMsgBytes(node, to_send, complete);
        node.m_transport->MarkBytesSent(to_send.size());
    }
    return complete;
}